

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  EXRChannelInfo *pEVar6;
  int *piVar7;
  EXRAttribute *pEVar8;
  int *piVar9;
  size_t c;
  ulong uVar10;
  size_t i;
  long lVar11;
  pointer p_Var12;
  pointer paVar13;
  long lVar14;
  pointer p_Var15;
  
  exr_header->pixel_aspect_ratio = info->pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info->screen_window_center[0];
  exr_header->screen_window_center[1] = info->screen_window_center[1];
  exr_header->screen_window_width = info->screen_window_width;
  exr_header->chunk_count = info->chunk_count;
  iVar1 = (info->display_window).min_y;
  iVar2 = (info->display_window).max_x;
  iVar3 = (info->display_window).max_y;
  (exr_header->display_window).min_x = (info->display_window).min_x;
  (exr_header->display_window).min_y = iVar1;
  (exr_header->display_window).max_x = iVar2;
  (exr_header->display_window).max_y = iVar3;
  iVar1 = (info->data_window).min_y;
  iVar2 = (info->data_window).max_x;
  iVar3 = (info->data_window).max_y;
  (exr_header->data_window).min_x = (info->data_window).min_x;
  (exr_header->data_window).min_y = iVar1;
  (exr_header->data_window).max_x = iVar2;
  (exr_header->data_window).max_y = iVar3;
  exr_header->line_order = info->line_order;
  exr_header->compression_type = info->compression_type;
  iVar1 = info->tile_size_y;
  iVar2 = info->tile_level_mode;
  iVar3 = info->tile_rounding_mode;
  exr_header->tile_size_x = info->tile_size_x;
  exr_header->tile_size_y = iVar1;
  exr_header->tile_level_mode = iVar2;
  exr_header->tile_rounding_mode = iVar3;
  paVar13 = (info->channels).
            super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = ((long)(info->channels).
                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)paVar13) / 0x30;
  exr_header->num_channels = (int)uVar5;
  pEVar6 = (EXRChannelInfo *)malloc((long)(int)uVar5 * 0x110);
  exr_header->channels = pEVar6;
  lVar11 = 0;
  lVar14 = 0;
  for (uVar10 = 0; uVar5 = (ulong)(int)uVar5, uVar10 < uVar5; uVar10 = uVar10 + 1) {
    strncpy(pEVar6->name + lVar11,*(char **)(paVar13->pad + lVar14 + -0x2d),0xff);
    exr_header->channels->pad[lVar11 + -0xe] = '\0';
    paVar13 = (info->channels).
              super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pEVar6 = exr_header->channels;
    *(undefined4 *)(pEVar6->pad + lVar11 + -0xd) =
         *(undefined4 *)(paVar13->pad + lVar14 + 0xfffffffffffffff3);
    pEVar6->pad[lVar11 + -1] = paVar13->pad[lVar14 + 0xffffffffffffffff];
    *(undefined8 *)(pEVar6->pad + lVar11 + -9) =
         *(undefined8 *)(paVar13->pad + lVar14 + 0xfffffffffffffff7);
    uVar5 = (ulong)(uint)exr_header->num_channels;
    lVar14 = lVar14 + 0x30;
    lVar11 = lVar11 + 0x110;
  }
  piVar7 = (int *)malloc(uVar5 * 4);
  exr_header->pixel_types = piVar7;
  piVar9 = &((info->channels).
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start)->pixel_type;
  for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
    piVar7[uVar10] = *piVar9;
    piVar9 = piVar9 + 0xc;
  }
  piVar7 = (int *)malloc(uVar5 * 4);
  exr_header->requested_pixel_types = piVar7;
  piVar9 = &((info->channels).
             super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>._M_impl
             .super__Vector_impl_data._M_start)->pixel_type;
  for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
    piVar7[uVar10] = *piVar9;
    piVar9 = piVar9 + 0xc;
  }
  p_Var15 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_start;
  p_Var12 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (uint)(((long)p_Var12 - (long)p_Var15) / 0x210);
  exr_header->num_custom_attributes = uVar4;
  if ((int)uVar4 < 1) {
    exr_header->custom_attributes = (EXRAttribute *)0x0;
  }
  else {
    if (0x80 < uVar4) {
      exr_header->num_custom_attributes = 0x80;
      uVar4 = 0x80;
    }
    pEVar8 = (EXRAttribute *)malloc((ulong)(uVar4 & 0x7fffffff) * 0x210);
    exr_header->custom_attributes = pEVar8;
    lVar11 = 0;
    for (uVar5 = 0; uVar5 < (ulong)(((long)p_Var12 - (long)p_Var15) / 0x210); uVar5 = uVar5 + 1) {
      memcpy(pEVar8->name + lVar11,p_Var15->name + lVar11,0x100);
      memcpy(exr_header->custom_attributes->type + lVar11,
             ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start)->type + lVar11,0x100);
      p_Var15 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pEVar8 = exr_header->custom_attributes;
      *(undefined4 *)((long)&pEVar8->size + lVar11) = *(undefined4 *)((long)&p_Var15->size + lVar11)
      ;
      *(undefined8 *)((long)&pEVar8->value + lVar11) =
           *(undefined8 *)((long)&p_Var15->value + lVar11);
      p_Var12 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = lVar11 + 0x210;
    }
  }
  exr_header->header_len = info->header_len;
  return;
}

Assistant:

static void ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;

  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < info.attributes.size(); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;
}